

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doJSONAcroform(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  allocator<char> local_a61;
  string local_a60;
  JSON local_a40;
  allocator<char> local_a29;
  JSON local_a28 [2];
  JSON local_a08;
  string local_9f8;
  JSON local_9d8;
  allocator<char> local_9c1;
  JSON local_9c0 [2];
  JSON local_9a0;
  undefined1 local_990 [40];
  JSON local_968 [2];
  JSON local_948;
  JSON local_938;
  allocator<char> local_921;
  JSON local_920 [2];
  undefined1 local_900 [8];
  JSON j_annot;
  JSON local_8e0;
  reference local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *choice;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  allocator<char> local_881;
  JSON local_880 [2];
  undefined1 local_860 [8];
  JSON j_choices;
  allocator<char> local_839;
  JSON local_838 [2];
  JSON local_818;
  JSON local_808;
  allocator<char> local_7f1;
  JSON local_7f0 [2];
  JSON local_7d0;
  JSON local_7c0;
  allocator<char> local_7a9;
  JSON local_7a8 [2];
  JSON local_788;
  JSON local_778;
  allocator<char> local_761;
  JSON local_760 [2];
  JSON local_740;
  JSON local_730;
  allocator<char> local_719;
  JSON local_718 [2];
  JSON local_6f8;
  undefined1 local_6e8 [40];
  JSON local_6c0 [2];
  JSON local_6a0;
  undefined1 local_690 [40];
  JSON local_668 [2];
  JSON local_648;
  string local_638;
  JSON local_618;
  allocator<char> local_601;
  JSON local_600 [2];
  JSON local_5e0;
  string local_5d0;
  JSON local_5b0;
  allocator<char> local_599;
  JSON local_598 [2];
  JSON local_578;
  string local_568;
  JSON local_548;
  allocator<char> local_531;
  JSON local_530 [2];
  JSON local_510;
  string local_500;
  JSON local_4e0;
  allocator<char> local_4c9;
  JSON local_4c8 [2];
  JSON local_4a8;
  JSON local_498;
  allocator<char> local_481;
  JSON local_480 [2];
  JSON local_460;
  string local_450;
  JSON local_430;
  allocator<char> local_419;
  JSON local_418 [2];
  JSON local_3f8;
  JSON local_3e8;
  allocator<char> local_3d1;
  JSON local_3d0 [2];
  JSON local_3b0;
  allocator<char> local_399;
  string local_398 [32];
  undefined1 local_378 [55];
  allocator<char> local_341;
  JSON local_340 [2];
  JSON local_320;
  undefined1 local_310 [40];
  JSON local_2e8 [2];
  JSON local_2c8;
  JSON local_2b8;
  undefined1 local_2a8 [8];
  JSON j_field;
  QPDFAnnotationObjectHelper local_288;
  undefined1 local_250 [8];
  QPDFFormFieldObjectHelper ffh;
  QPDFAnnotationObjectHelper *aoh;
  iterator __end2;
  iterator __begin2;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_1c8;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *local_1b0;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *__range2;
  QPDFPageObjectHelper *page;
  __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
  local_198;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_168;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_150;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  undefined1 local_140 [4];
  int pagepos1;
  allocator<char> local_129;
  JSON local_128 [2];
  undefined1 local_108 [8];
  JSON j_fields;
  allocator<char> local_e1;
  JSON local_e0 [2];
  JSON local_c0;
  JSON local_b0;
  allocator<char> local_99;
  JSON local_98 [2];
  JSON local_78 [2];
  undefined1 local_58 [8];
  QPDFAcroFormDocumentHelper afdh;
  JSON j_acroform;
  QPDF *pdf_local;
  bool *first_local;
  Pipeline *p_local;
  QPDFJob *this_local;
  
  JSON::makeDictionary();
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)local_58,pdf)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"hasacroform",&local_99);
  bVar1 = QPDFAcroFormDocumentHelper::hasAcroForm((QPDFAcroFormDocumentHelper *)local_58);
  JSON::makeBool(&local_b0,bVar1);
  JSON::addDictionaryMember
            (local_78,(string *)
                      &afdh.m.
                       super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,local_98);
  JSON::~JSON(local_78);
  JSON::~JSON(&local_b0);
  std::__cxx11::string::~string((string *)local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e0,"needappearances",&local_e1)
  ;
  bVar1 = QPDFAcroFormDocumentHelper::getNeedAppearances((QPDFAcroFormDocumentHelper *)local_58);
  JSON::makeBool((JSON *)&j_fields.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,bVar1);
  JSON::addDictionaryMember
            (&local_c0,
             (string *)
             &afdh.m.
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_e0);
  JSON::~JSON(&local_c0);
  JSON::~JSON((JSON *)&j_fields.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::__cxx11::string::~string((string *)local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_128,"fields",&local_129);
  JSON::makeArray();
  JSON::addDictionaryMember
            ((JSON *)local_108,
             (string *)
             &afdh.m.
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_128);
  JSON::~JSON((JSON *)local_140);
  std::__cxx11::string::~string((string *)local_128);
  std::allocator<char>::~allocator(&local_129);
  __range1._4_4_ = 0;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1,pdf);
  QPDFPageDocumentHelper::getAllPages(&local_168,(QPDFPageDocumentHelper *)&__begin1);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1);
  local_150 = &local_168;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                     (local_150);
  local_198._M_current =
       (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_150);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_198), bVar1) {
    __range2 = (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
               __gnu_cxx::
               __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
               ::operator*(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
    QPDFPageObjectHelper::QPDFPageObjectHelper
              ((QPDFPageObjectHelper *)&__begin2,(QPDFPageObjectHelper *)__range2);
    QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage
              (&local_1c8,(QPDFAcroFormDocumentHelper *)local_58,(QPDFPageObjectHelper *)&__begin2);
    QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&__begin2);
    local_1b0 = &local_1c8;
    __end2 = std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
             begin(local_1b0);
    aoh = (QPDFAnnotationObjectHelper *)
          std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::end
                    (local_1b0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                                       *)&aoh), bVar1) {
      ffh.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
           ::operator*(&__end2);
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper
                (&local_288,
                 (QPDFAnnotationObjectHelper *)
                 ffh.m.
                 super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      QPDFAcroFormDocumentHelper::getFieldForAnnotation
                ((QPDFFormFieldObjectHelper *)local_250,(QPDFAcroFormDocumentHelper *)local_58,
                 &local_288);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_288);
      QPDFObjectHelper::getObjectHandle
                ((QPDFObjectHelper *)
                 &j_field.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar1 = QPDFObjectHandle::isDictionary
                        ((QPDFObjectHandle *)
                         &j_field.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &j_field.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        JSON::makeDictionary();
        JSON::addArrayElement((JSON *)local_2a8,(JSON *)local_108);
        JSON::~JSON(&local_2b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2e8,"object",(allocator<char> *)(local_310 + 0x27));
        QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_310);
        peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)(local_310 + 0x10),(int)local_310,
                   SUB41(peVar3->json_version,0));
        JSON::addDictionaryMember(&local_2c8,(string *)local_2a8,local_2e8);
        JSON::~JSON(&local_2c8);
        JSON::~JSON((JSON *)(local_310 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_310);
        std::__cxx11::string::~string((string *)local_2e8);
        std::allocator<char>::~allocator((allocator<char> *)(local_310 + 0x27));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_340,"parent",&local_341);
        QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_378);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_398,"/Parent",&local_399);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_378 + 0x10),(string *)local_378);
        peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)(local_378 + 0x20),(int)local_378 + 0x10,
                   SUB41(peVar3->json_version,0));
        JSON::addDictionaryMember(&local_320,(string *)local_2a8,local_340);
        JSON::~JSON(&local_320);
        JSON::~JSON((JSON *)(local_378 + 0x20));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_378 + 0x10));
        std::__cxx11::string::~string(local_398);
        std::allocator<char>::~allocator(&local_399);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_378);
        std::__cxx11::string::~string((string *)local_340);
        std::allocator<char>::~allocator(&local_341);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3d0,"pageposfrom1",&local_3d1);
        JSON::makeInt(&local_3e8,(long)__range1._4_4_);
        JSON::addDictionaryMember(&local_3b0,(string *)local_2a8,local_3d0);
        JSON::~JSON(&local_3b0);
        JSON::~JSON(&local_3e8);
        std::__cxx11::string::~string((string *)local_3d0);
        std::allocator<char>::~allocator(&local_3d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_418,"fieldtype",&local_419);
        QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_
                  (&local_450,(QPDFFormFieldObjectHelper *)local_250);
        JSON::makeString(&local_430,&local_450);
        JSON::addDictionaryMember(&local_3f8,(string *)local_2a8,local_418);
        JSON::~JSON(&local_3f8);
        JSON::~JSON(&local_430);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)local_418);
        std::allocator<char>::~allocator(&local_419);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_480,"fieldflags",&local_481);
        iVar2 = QPDFFormFieldObjectHelper::getFlags((QPDFFormFieldObjectHelper *)local_250);
        JSON::makeInt(&local_498,(long)iVar2);
        JSON::addDictionaryMember(&local_460,(string *)local_2a8,local_480);
        JSON::~JSON(&local_460);
        JSON::~JSON(&local_498);
        std::__cxx11::string::~string((string *)local_480);
        std::allocator<char>::~allocator(&local_481);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4c8,"fullname",&local_4c9);
        QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_
                  (&local_500,(QPDFFormFieldObjectHelper *)local_250);
        JSON::makeString(&local_4e0,&local_500);
        JSON::addDictionaryMember(&local_4a8,(string *)local_2a8,local_4c8);
        JSON::~JSON(&local_4a8);
        JSON::~JSON(&local_4e0);
        std::__cxx11::string::~string((string *)&local_500);
        std::__cxx11::string::~string((string *)local_4c8);
        std::allocator<char>::~allocator(&local_4c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_530,"partialname",&local_531);
        QPDFFormFieldObjectHelper::getPartialName_abi_cxx11_
                  (&local_568,(QPDFFormFieldObjectHelper *)local_250);
        JSON::makeString(&local_548,&local_568);
        JSON::addDictionaryMember(&local_510,(string *)local_2a8,local_530);
        JSON::~JSON(&local_510);
        JSON::~JSON(&local_548);
        std::__cxx11::string::~string((string *)&local_568);
        std::__cxx11::string::~string((string *)local_530);
        std::allocator<char>::~allocator(&local_531);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_598,"alternativename",&local_599);
        QPDFFormFieldObjectHelper::getAlternativeName_abi_cxx11_
                  (&local_5d0,(QPDFFormFieldObjectHelper *)local_250);
        JSON::makeString(&local_5b0,&local_5d0);
        JSON::addDictionaryMember(&local_578,(string *)local_2a8,local_598);
        JSON::~JSON(&local_578);
        JSON::~JSON(&local_5b0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::~string((string *)local_598);
        std::allocator<char>::~allocator(&local_599);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_600,"mappingname",&local_601);
        QPDFFormFieldObjectHelper::getMappingName_abi_cxx11_
                  (&local_638,(QPDFFormFieldObjectHelper *)local_250);
        JSON::makeString(&local_618,&local_638);
        JSON::addDictionaryMember(&local_5e0,(string *)local_2a8,local_600);
        JSON::~JSON(&local_5e0);
        JSON::~JSON(&local_618);
        std::__cxx11::string::~string((string *)&local_638);
        std::__cxx11::string::~string((string *)local_600);
        std::allocator<char>::~allocator(&local_601);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_668,"value",(allocator<char> *)(local_690 + 0x27));
        QPDFFormFieldObjectHelper::getValue((QPDFFormFieldObjectHelper *)local_690);
        peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)(local_690 + 0x10),(int)local_690,
                   SUB41(peVar3->json_version,0));
        JSON::addDictionaryMember(&local_648,(string *)local_2a8,local_668);
        JSON::~JSON(&local_648);
        JSON::~JSON((JSON *)(local_690 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_690);
        std::__cxx11::string::~string((string *)local_668);
        std::allocator<char>::~allocator((allocator<char> *)(local_690 + 0x27));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_6c0,"defaultvalue",(allocator<char> *)(local_6e8 + 0x27));
        QPDFFormFieldObjectHelper::getDefaultValue((QPDFFormFieldObjectHelper *)local_6e8);
        peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)(local_6e8 + 0x10),(int)local_6e8,
                   SUB41(peVar3->json_version,0));
        JSON::addDictionaryMember(&local_6a0,(string *)local_2a8,local_6c0);
        JSON::~JSON(&local_6a0);
        JSON::~JSON((JSON *)(local_6e8 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_6e8);
        std::__cxx11::string::~string((string *)local_6c0);
        std::allocator<char>::~allocator((allocator<char> *)(local_6e8 + 0x27));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_718,"quadding",&local_719);
        iVar2 = QPDFFormFieldObjectHelper::getQuadding((QPDFFormFieldObjectHelper *)local_250);
        JSON::makeInt(&local_730,(long)iVar2);
        JSON::addDictionaryMember(&local_6f8,(string *)local_2a8,local_718);
        JSON::~JSON(&local_6f8);
        JSON::~JSON(&local_730);
        std::__cxx11::string::~string((string *)local_718);
        std::allocator<char>::~allocator(&local_719);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_760,"ischeckbox",&local_761);
        bVar1 = QPDFFormFieldObjectHelper::isCheckbox((QPDFFormFieldObjectHelper *)local_250);
        JSON::makeBool(&local_778,bVar1);
        JSON::addDictionaryMember(&local_740,(string *)local_2a8,local_760);
        JSON::~JSON(&local_740);
        JSON::~JSON(&local_778);
        std::__cxx11::string::~string((string *)local_760);
        std::allocator<char>::~allocator(&local_761);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7a8,"isradiobutton",&local_7a9);
        bVar1 = QPDFFormFieldObjectHelper::isRadioButton((QPDFFormFieldObjectHelper *)local_250);
        JSON::makeBool(&local_7c0,bVar1);
        JSON::addDictionaryMember(&local_788,(string *)local_2a8,local_7a8);
        JSON::~JSON(&local_788);
        JSON::~JSON(&local_7c0);
        std::__cxx11::string::~string((string *)local_7a8);
        std::allocator<char>::~allocator(&local_7a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7f0,"ischoice",&local_7f1);
        bVar1 = QPDFFormFieldObjectHelper::isChoice((QPDFFormFieldObjectHelper *)local_250);
        JSON::makeBool(&local_808,bVar1);
        JSON::addDictionaryMember(&local_7d0,(string *)local_2a8,local_7f0);
        JSON::~JSON(&local_7d0);
        JSON::~JSON(&local_808);
        std::__cxx11::string::~string((string *)local_7f0);
        std::allocator<char>::~allocator(&local_7f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_838,"istext",&local_839);
        bVar1 = QPDFFormFieldObjectHelper::isText((QPDFFormFieldObjectHelper *)local_250);
        JSON::makeBool((JSON *)&j_choices.m.
                                super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,bVar1);
        JSON::addDictionaryMember(&local_818,(string *)local_2a8,local_838);
        JSON::~JSON(&local_818);
        JSON::~JSON((JSON *)&j_choices.m.
                             super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
        std::__cxx11::string::~string((string *)local_838);
        std::allocator<char>::~allocator(&local_839);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_880,"choices",&local_881)
        ;
        JSON::makeArray();
        JSON::addDictionaryMember((JSON *)local_860,(string *)local_2a8,local_880);
        JSON::~JSON((JSON *)&__range3);
        std::__cxx11::string::~string((string *)local_880);
        std::allocator<char>::~allocator(&local_881);
        QPDFFormFieldObjectHelper::getChoices_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin3,(QPDFFormFieldObjectHelper *)local_250);
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__begin3);
        choice = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin3);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&choice), bVar1) {
          local_8d0 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          JSON::makeString((JSON *)&j_annot.m.
                                    super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount,local_8d0);
          JSON::addArrayElement(&local_8e0,(JSON *)local_860);
          JSON::~JSON(&local_8e0);
          JSON::~JSON((JSON *)&j_annot.m.
                               super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        page._4_4_ = 6;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__begin3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_920,"annotation",&local_921);
        JSON::makeDictionary();
        JSON::addDictionaryMember((JSON *)local_900,(string *)local_2a8,local_920);
        JSON::~JSON(&local_938);
        std::__cxx11::string::~string((string *)local_920);
        std::allocator<char>::~allocator(&local_921);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_968,"object",(allocator<char> *)(local_990 + 0x27));
        QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_990);
        peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)(local_990 + 0x10),(int)local_990,
                   SUB41(peVar3->json_version,0));
        JSON::addDictionaryMember(&local_948,(string *)local_900,local_968);
        JSON::~JSON(&local_948);
        JSON::~JSON((JSON *)(local_990 + 0x10));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_990);
        std::__cxx11::string::~string((string *)local_968);
        std::allocator<char>::~allocator((allocator<char> *)(local_990 + 0x27));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_9c0,"appearancestate",&local_9c1);
        QPDFAnnotationObjectHelper::getAppearanceState_abi_cxx11_
                  (&local_9f8,
                   (QPDFAnnotationObjectHelper *)
                   ffh.m.
                   super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        JSON::makeString(&local_9d8,&local_9f8);
        JSON::addDictionaryMember(&local_9a0,(string *)local_900,local_9c0);
        JSON::~JSON(&local_9a0);
        JSON::~JSON(&local_9d8);
        std::__cxx11::string::~string((string *)&local_9f8);
        std::__cxx11::string::~string((string *)local_9c0);
        std::allocator<char>::~allocator(&local_9c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_a28,"annotationflags",&local_a29);
        iVar2 = QPDFAnnotationObjectHelper::getFlags
                          ((QPDFAnnotationObjectHelper *)
                           ffh.m.
                           super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
        JSON::makeInt(&local_a40,(long)iVar2);
        JSON::addDictionaryMember(&local_a08,(string *)local_900,local_a28);
        JSON::~JSON(&local_a08);
        JSON::~JSON(&local_a40);
        std::__cxx11::string::~string((string *)local_a28);
        std::allocator<char>::~allocator(&local_a29);
        JSON::~JSON((JSON *)local_900);
        JSON::~JSON((JSON *)local_860);
        JSON::~JSON((JSON *)local_2a8);
        page._4_4_ = 0;
      }
      else {
        page._4_4_ = 5;
      }
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)local_250);
      __gnu_cxx::
      __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
      ::operator++(&__end2);
    }
    page._4_4_ = 4;
    std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
              (&local_1c8);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  page._4_4_ = 2;
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a60,"acroform",&local_a61);
  JSON::writeDictionaryItem
            (p,first,&local_a60,
             (JSON *)&afdh.m.
                      super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,1);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator(&local_a61);
  JSON::~JSON((JSON *)local_108);
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)local_58);
  JSON::~JSON((JSON *)&afdh.m.
                       super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  return;
}

Assistant:

void
QPDFJob::doJSONAcroform(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON j_acroform = JSON::makeDictionary();
    QPDFAcroFormDocumentHelper afdh(pdf);
    j_acroform.addDictionaryMember("hasacroform", JSON::makeBool(afdh.hasAcroForm()));
    j_acroform.addDictionaryMember("needappearances", JSON::makeBool(afdh.getNeedAppearances()));
    JSON j_fields = j_acroform.addDictionaryMember("fields", JSON::makeArray());
    int pagepos1 = 0;
    for (auto const& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        ++pagepos1;
        for (auto& aoh: afdh.getWidgetAnnotationsForPage(page)) {
            QPDFFormFieldObjectHelper ffh = afdh.getFieldForAnnotation(aoh);
            if (!ffh.getObjectHandle().isDictionary()) {
                continue;
            }
            JSON j_field = j_fields.addArrayElement(JSON::makeDictionary());
            j_field.addDictionaryMember("object", ffh.getObjectHandle().getJSON(m->json_version));
            j_field.addDictionaryMember(
                "parent", ffh.getObjectHandle().getKey("/Parent").getJSON(m->json_version));
            j_field.addDictionaryMember("pageposfrom1", JSON::makeInt(pagepos1));
            j_field.addDictionaryMember("fieldtype", JSON::makeString(ffh.getFieldType()));
            j_field.addDictionaryMember("fieldflags", JSON::makeInt(ffh.getFlags()));
            j_field.addDictionaryMember("fullname", JSON::makeString(ffh.getFullyQualifiedName()));
            j_field.addDictionaryMember("partialname", JSON::makeString(ffh.getPartialName()));
            j_field.addDictionaryMember(
                "alternativename", JSON::makeString(ffh.getAlternativeName()));
            j_field.addDictionaryMember("mappingname", JSON::makeString(ffh.getMappingName()));
            j_field.addDictionaryMember("value", ffh.getValue().getJSON(m->json_version));
            j_field.addDictionaryMember(
                "defaultvalue", ffh.getDefaultValue().getJSON(m->json_version));
            j_field.addDictionaryMember("quadding", JSON::makeInt(ffh.getQuadding()));
            j_field.addDictionaryMember("ischeckbox", JSON::makeBool(ffh.isCheckbox()));
            j_field.addDictionaryMember("isradiobutton", JSON::makeBool(ffh.isRadioButton()));
            j_field.addDictionaryMember("ischoice", JSON::makeBool(ffh.isChoice()));
            j_field.addDictionaryMember("istext", JSON::makeBool(ffh.isText()));
            JSON j_choices = j_field.addDictionaryMember("choices", JSON::makeArray());
            for (auto const& choice: ffh.getChoices()) {
                j_choices.addArrayElement(JSON::makeString(choice));
            }
            JSON j_annot = j_field.addDictionaryMember("annotation", JSON::makeDictionary());
            j_annot.addDictionaryMember("object", aoh.getObjectHandle().getJSON(m->json_version));
            j_annot.addDictionaryMember(
                "appearancestate", JSON::makeString(aoh.getAppearanceState()));
            j_annot.addDictionaryMember("annotationflags", JSON::makeInt(aoh.getFlags()));
        }
    }
    JSON::writeDictionaryItem(p, first, "acroform", j_acroform, 1);
}